

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_func.cpp
# Opt level: O3

void __thiscall FParser::SF_Player(FParser *this)

{
  int iVar1;
  AActor *pAVar2;
  
  if (this->t_argc == 0) {
    pAVar2 = (this->Script->trigger).field_0.p;
    if (pAVar2 != (AActor *)0x0) {
      if (((pAVar2->super_DThinker).super_DObject.ObjectFlags & 0x20) == 0) {
        (this->t_return).type = 1;
        goto LAB_006a7365;
      }
      (this->Script->trigger).field_0.p = (AActor *)0x0;
    }
    (this->t_return).type = 1;
  }
  else {
    pAVar2 = actorvalue(this->t_argv);
    (this->t_return).type = 1;
    if (pAVar2 != (AActor *)0x0) {
LAB_006a7365:
      if (pAVar2->player != (player_t *)0x0) {
        iVar1 = (int)((ulong)&pAVar2->player[-0x3f3e].original_oldbuttons >> 5) * 0x3cf3cf3d;
        goto LAB_006a739e;
      }
    }
  }
  iVar1 = -1;
LAB_006a739e:
  (this->t_return).value.i = iVar1;
  return;
}

Assistant:

void FParser::SF_Player(void)
{
	// use trigger object if not specified
	AActor *mo;
	if(t_argc)
	{
		mo = actorvalue(t_argv[0]);
	}
	else
	{
		mo = Script->trigger;
	}

	t_return.type = svt_int;
	
	if(mo && mo->player) // haleyjd: added mo->player
	{
		t_return.value.i = (int)(mo->player - players);
	}
	else
	{
		t_return.value.i = -1;
	}
}